

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.h
# Opt level: O1

void __thiscall chrono::ChBodyEasyMesh::~ChBodyEasyMesh(ChBodyEasyMesh *this)

{
  ChBody::~ChBody((ChBody *)
                  ((long)&this[-1].super_ChBodyAuxRef.auxref_to_cog.super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                  0x20),&PTR_construction_vtable_24__00b303b0);
  free(*(void **)((long)&this[-1].super_ChBodyAuxRef.auxref_to_cog.super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                 0x18));
  return;
}

Assistant:

class ChApi ChBodyEasyMesh : public ChBodyAuxRef {
  public:
    /// Create a ChBodyAuxRef with optional mesh visualization and/or collision shape. The mesh is assumed to be
    /// provided in a Wavefront OBJ file and defined with respect to the body reference frame. Mass and inertia are set
    /// automatically depending on density.
    ChBodyEasyMesh(const std::string& filename,  ///< name of the Wavefront OBJ file
                   double density,               ///< density of the body
                   bool compute_mass = true,     ///< automatic evaluation of inertia properties
                   bool visualize = true,        ///< create visualization asset
                   bool collide = false,         ///< enable collision
                   std::shared_ptr<ChMaterialSurface> material = nullptr,  ///< surface contact material
                   double sphere_swept = 0.001,  ///< thickness (collision detection robustness)
                   std::shared_ptr<collision::ChCollisionModel> collision_model =
                       chrono_types::make_shared<collision::ChCollisionModelBullet>()  ///< collision model
    );

    /// Create a ChBodyAuxRef with optional mesh visualization and/or collision shape. The mesh is defined with respect
    /// to the body reference frame. Mass and inertia are set automatically depending on density.
    ChBodyEasyMesh(std::shared_ptr<geometry::ChTriangleMeshConnected> mesh,  ///< triangular mesh
                   double density,                                           ///< density of the body
                   bool compute_mass = true,  ///< automatic evaluation of inertia properties
                   bool visualize = true,     ///< create visualization asset
                   bool collide = false,      ///< enable collision
                   std::shared_ptr<ChMaterialSurface> material = nullptr,  ///< surface contact material
                   double sphere_swept = 0.001,  ///< thickness (collision detection robustness)
                   std::shared_ptr<collision::ChCollisionModel> collision_model =
                       chrono_types::make_shared<collision::ChCollisionModelBullet>()  ///< collision model
    );

    /// Create a ChBodyAuxRef with a mesh visualization and collision shape using the specified collision model type.
    /// The mesh is assumed to be provided in a Wavefront OBJ file and defined with respect to the body reference
    /// frame. Mass and inertia are set automatically depending on density.
    ChBodyEasyMesh(const std::string& filename,                     ///< name of the Wavefront OBJ file
                   double density,                                  ///< density of the body
                   std::shared_ptr<ChMaterialSurface> material,     ///< surface contact material
                   double sphere_swept,                             ///< thickness (collision detection robustness)
                   collision::ChCollisionSystemType collision_type  ///< collision model type
    );

    /// Create a ChBodyAuxRef with a convex hull visualization and collision shape using the specified collision model
    /// type. The mesh is defined with respect to the body reference frame. Mass and inertia are set automatically
    /// depending on density.
    ChBodyEasyMesh(std::shared_ptr<geometry::ChTriangleMeshConnected> mesh,  ///< triangular mesh
                   double density,                                           ///< density of the body
                   std::shared_ptr<ChMaterialSurface> material,              ///< surface contact material
                   double sphere_swept,                             ///< thickness (collision detection robustness)
                   collision::ChCollisionSystemType collision_type  ///< collision model type
    );

  private:
    void SetupBody(std::shared_ptr<geometry::ChTriangleMeshConnected> trimesh,
                   const std::string& name,
                   double density,
                   bool compute_mass,
                   bool visualize,
                   bool collide,
                   std::shared_ptr<ChMaterialSurface> material,
                   double sphere_swept);
}